

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O0

void pffft_zconvolve_accumulate(PFFFT_Setup *s,float *a,float *b,float *ab,float scaling)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  float *pfVar16;
  v4sf tmp_1;
  v4sf tmp;
  v4sf bi_1;
  v4sf br_1;
  v4sf ai_1;
  v4sf ar_1;
  int local_31c;
  int i;
  v4sf vscal;
  float abi;
  float abr;
  float bi;
  float br;
  float ai;
  float ar;
  v4sf *vab;
  v4sf *vb;
  v4sf *va;
  int Ncvec;
  float scaling_local;
  float *ab_local;
  float *b_local;
  float *a_local;
  PFFFT_Setup *s_local;
  float fStack_2a0;
  float fStack_29c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  
  iVar7 = s->Ncvec;
  if (((((ulong)a & 0xf) == 0) && (((ulong)b & 0xf) == 0)) && (((ulong)ab & 0xf) == 0)) {
    fVar1 = *a;
    fVar2 = a[4];
    fVar3 = *b;
    fVar4 = b[4];
    fVar5 = *ab;
    fVar6 = ab[4];
    for (local_31c = 0; local_31c < iVar7; local_31c = local_31c + 2) {
      uVar8 = *(undefined8 *)(a + (long)(local_31c << 1) * 4);
      uVar9 = *(undefined8 *)(a + (long)(local_31c << 1) * 4 + 2);
      uVar10 = *(undefined8 *)(a + (long)(local_31c * 2 + 1) * 4);
      uVar11 = *(undefined8 *)(a + (long)(local_31c * 2 + 1) * 4 + 2);
      uVar12 = *(undefined8 *)(b + (long)(local_31c << 1) * 4);
      uVar13 = *(undefined8 *)(b + (long)(local_31c << 1) * 4 + 2);
      uVar14 = *(undefined8 *)(b + (long)(local_31c * 2 + 1) * 4);
      uVar15 = *(undefined8 *)(b + (long)(local_31c * 2 + 1) * 4 + 2);
      local_78 = (float)uVar8;
      fStack_74 = (float)((ulong)uVar8 >> 0x20);
      fStack_70 = (float)uVar9;
      fStack_6c = (float)((ulong)uVar9 >> 0x20);
      local_88 = (float)uVar14;
      fStack_84 = (float)((ulong)uVar14 >> 0x20);
      fStack_80 = (float)uVar15;
      fStack_7c = (float)((ulong)uVar15 >> 0x20);
      local_a8 = (float)uVar12;
      fStack_a4 = (float)((ulong)uVar12 >> 0x20);
      fStack_a0 = (float)uVar13;
      fStack_9c = (float)((ulong)uVar13 >> 0x20);
      local_b8 = (float)uVar10;
      fStack_b4 = (float)((ulong)uVar10 >> 0x20);
      fStack_b0 = (float)uVar11;
      fStack_ac = (float)((ulong)uVar11 >> 0x20);
      uVar8 = *(undefined8 *)(ab + (long)(local_31c << 1) * 4);
      uVar9 = *(undefined8 *)(ab + (long)(local_31c << 1) * 4 + 2);
      local_228 = (float)uVar8;
      fStack_224 = (float)((ulong)uVar8 >> 0x20);
      fStack_220 = (float)uVar9;
      fStack_21c = (float)((ulong)uVar9 >> 0x20);
      pfVar16 = ab + (long)(local_31c << 1) * 4;
      *pfVar16 = (local_78 * local_a8 - local_b8 * local_88) * scaling + local_228;
      pfVar16[1] = (fStack_74 * fStack_a4 - fStack_b4 * fStack_84) * scaling + fStack_224;
      pfVar16[2] = (fStack_70 * fStack_a0 - fStack_b0 * fStack_80) * scaling + fStack_220;
      pfVar16[3] = (fStack_6c * fStack_9c - fStack_ac * fStack_7c) * scaling + fStack_21c;
      uVar8 = *(undefined8 *)(ab + (long)(local_31c * 2 + 1) * 4);
      uVar9 = *(undefined8 *)(ab + (long)(local_31c * 2 + 1) * 4 + 2);
      local_248 = (float)uVar8;
      fStack_244 = (float)((ulong)uVar8 >> 0x20);
      fStack_240 = (float)uVar9;
      fStack_23c = (float)((ulong)uVar9 >> 0x20);
      pfVar16 = ab + (long)(local_31c * 2 + 1) * 4;
      *pfVar16 = (local_b8 * local_a8 + local_78 * local_88) * scaling + local_248;
      pfVar16[1] = (fStack_b4 * fStack_a4 + fStack_74 * fStack_84) * scaling + fStack_244;
      pfVar16[2] = (fStack_b0 * fStack_a0 + fStack_70 * fStack_80) * scaling + fStack_240;
      pfVar16[3] = (fStack_ac * fStack_9c + fStack_6c * fStack_7c) * scaling + fStack_23c;
      uVar8 = *(undefined8 *)(a + (long)(local_31c * 2 + 2) * 4);
      uVar9 = *(undefined8 *)(a + (long)(local_31c * 2 + 2) * 4 + 2);
      uVar10 = *(undefined8 *)(a + (long)(local_31c * 2 + 3) * 4);
      uVar11 = *(undefined8 *)(a + (long)(local_31c * 2 + 3) * 4 + 2);
      uVar12 = *(undefined8 *)(b + (long)(local_31c * 2 + 2) * 4);
      uVar13 = *(undefined8 *)(b + (long)(local_31c * 2 + 2) * 4 + 2);
      uVar14 = *(undefined8 *)(b + (long)(local_31c * 2 + 3) * 4);
      uVar15 = *(undefined8 *)(b + (long)(local_31c * 2 + 3) * 4 + 2);
      local_138 = (float)uVar8;
      fStack_134 = (float)((ulong)uVar8 >> 0x20);
      fStack_130 = (float)uVar9;
      fStack_12c = (float)((ulong)uVar9 >> 0x20);
      local_148 = (float)uVar14;
      fStack_144 = (float)((ulong)uVar14 >> 0x20);
      fStack_140 = (float)uVar15;
      fStack_13c = (float)((ulong)uVar15 >> 0x20);
      local_168 = (float)uVar12;
      fStack_164 = (float)((ulong)uVar12 >> 0x20);
      fStack_160 = (float)uVar13;
      fStack_15c = (float)((ulong)uVar13 >> 0x20);
      local_178 = (float)uVar10;
      fStack_174 = (float)((ulong)uVar10 >> 0x20);
      fStack_170 = (float)uVar11;
      fStack_16c = (float)((ulong)uVar11 >> 0x20);
      uVar8 = *(undefined8 *)(ab + (long)(local_31c * 2 + 2) * 4);
      uVar9 = *(undefined8 *)(ab + (long)(local_31c * 2 + 2) * 4 + 2);
      local_288 = (float)uVar8;
      fStack_284 = (float)((ulong)uVar8 >> 0x20);
      fStack_280 = (float)uVar9;
      fStack_27c = (float)((ulong)uVar9 >> 0x20);
      pfVar16 = ab + (long)(local_31c * 2 + 2) * 4;
      *pfVar16 = (local_138 * local_168 - local_178 * local_148) * scaling + local_288;
      pfVar16[1] = (fStack_134 * fStack_164 - fStack_174 * fStack_144) * scaling + fStack_284;
      pfVar16[2] = (fStack_130 * fStack_160 - fStack_170 * fStack_140) * scaling + fStack_280;
      pfVar16[3] = (fStack_12c * fStack_15c - fStack_16c * fStack_13c) * scaling + fStack_27c;
      uVar8 = *(undefined8 *)(ab + (long)(local_31c * 2 + 3) * 4);
      uVar9 = *(undefined8 *)(ab + (long)(local_31c * 2 + 3) * 4 + 2);
      s_local._0_4_ = (float)uVar8;
      s_local._4_4_ = (float)((ulong)uVar8 >> 0x20);
      fStack_2a0 = (float)uVar9;
      fStack_29c = (float)((ulong)uVar9 >> 0x20);
      pfVar16 = ab + (long)(local_31c * 2 + 3) * 4;
      *pfVar16 = (local_178 * local_168 + local_138 * local_148) * scaling + s_local._0_4_;
      pfVar16[1] = (fStack_174 * fStack_164 + fStack_134 * fStack_144) * scaling + s_local._4_4_;
      pfVar16[2] = (fStack_170 * fStack_160 + fStack_130 * fStack_140) * scaling + fStack_2a0;
      pfVar16[3] = (fStack_16c * fStack_15c + fStack_12c * fStack_13c) * scaling + fStack_29c;
    }
    if (s->transform == PFFFT_REAL) {
      *ab = fVar1 * fVar3 * scaling + fVar5;
      ab[4] = fVar2 * fVar4 * scaling + fVar6;
    }
    return;
  }
  __assert_fail("VALIGNED(a) && VALIGNED(b) && VALIGNED(ab)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x6ac,
                "void pffft_zconvolve_accumulate(PFFFT_Setup *, const float *, const float *, float *, float)"
               );
}

Assistant:

void pffft_zconvolve_accumulate(PFFFT_Setup *s, const float *a, const float *b, float *ab, float scaling) {
  int Ncvec = s->Ncvec;
  const v4sf * RESTRICT va = (const v4sf*)a;
  const v4sf * RESTRICT vb = (const v4sf*)b;
  v4sf * RESTRICT vab = (v4sf*)ab;

#ifdef __arm__
  __builtin_prefetch(va);
  __builtin_prefetch(vb);
  __builtin_prefetch(vab);
  __builtin_prefetch(va+2);
  __builtin_prefetch(vb+2);
  __builtin_prefetch(vab+2);
  __builtin_prefetch(va+4);
  __builtin_prefetch(vb+4);
  __builtin_prefetch(vab+4);
  __builtin_prefetch(va+6);
  __builtin_prefetch(vb+6);
  __builtin_prefetch(vab+6);
# ifndef __clang__
#   define ZCONVOLVE_USING_INLINE_NEON_ASM
# endif
#endif

  float ar, ai, br, bi, abr, abi;
#ifndef ZCONVOLVE_USING_INLINE_ASM
  v4sf vscal = LD_PS1(scaling);
  int i;
#endif

  assert(VALIGNED(a) && VALIGNED(b) && VALIGNED(ab));
  ar = ((v4sf_union*)va)[0].f[0];
  ai = ((v4sf_union*)va)[1].f[0];
  br = ((v4sf_union*)vb)[0].f[0];
  bi = ((v4sf_union*)vb)[1].f[0];
  abr = ((v4sf_union*)vab)[0].f[0];
  abi = ((v4sf_union*)vab)[1].f[0];
 
#ifdef ZCONVOLVE_USING_INLINE_ASM // inline asm version, unfortunately miscompiled by clang 3.2, at least on ubuntu.. so this will be restricted to gcc
  const float *a_ = a, *b_ = b; float *ab_ = ab;
  int N = Ncvec;
  asm volatile("mov         r8, %2                  \n"
               "vdup.f32    q15, %4                 \n"
               "1:                                  \n"
               "pld         [%0,#64]                \n"
               "pld         [%1,#64]                \n"
               "pld         [%2,#64]                \n"
               "pld         [%0,#96]                \n"
               "pld         [%1,#96]                \n"
               "pld         [%2,#96]                \n"
               "vld1.f32    {q0,q1},   [%0,:128]!         \n"
               "vld1.f32    {q4,q5},   [%1,:128]!         \n"
               "vld1.f32    {q2,q3},   [%0,:128]!         \n"
               "vld1.f32    {q6,q7},   [%1,:128]!         \n"
               "vld1.f32    {q8,q9},   [r8,:128]!          \n"
               
               "vmul.f32    q10, q0, q4             \n"
               "vmul.f32    q11, q0, q5             \n"
               "vmul.f32    q12, q2, q6             \n" 
               "vmul.f32    q13, q2, q7             \n"                 
               "vmls.f32    q10, q1, q5             \n"
               "vmla.f32    q11, q1, q4             \n"
               "vld1.f32    {q0,q1}, [r8,:128]!     \n"
               "vmls.f32    q12, q3, q7             \n"
               "vmla.f32    q13, q3, q6             \n"
               "vmla.f32    q8, q10, q15            \n"
               "vmla.f32    q9, q11, q15            \n"
               "vmla.f32    q0, q12, q15            \n"
               "vmla.f32    q1, q13, q15            \n"
               "vst1.f32    {q8,q9},[%2,:128]!    \n"
               "vst1.f32    {q0,q1},[%2,:128]!    \n"
               "subs        %3, #2                  \n"
               "bne         1b                      \n"
               : "+r"(a_), "+r"(b_), "+r"(ab_), "+r"(N) : "r"(scaling) : "r8", "q0","q1","q2","q3","q4","q5","q6","q7","q8","q9", "q10","q11","q12","q13","q15","memory");
#else // default routine, works fine for non-arm cpus with current compilers
  for (i=0; i < Ncvec; i += 2) {
    v4sf ar, ai, br, bi;
    ar = va[2*i+0]; ai = va[2*i+1];
    br = vb[2*i+0]; bi = vb[2*i+1];
    VCPLXMUL(ar, ai, br, bi);
    vab[2*i+0] = VMADD(ar, vscal, vab[2*i+0]);
    vab[2*i+1] = VMADD(ai, vscal, vab[2*i+1]);
    ar = va[2*i+2]; ai = va[2*i+3];
    br = vb[2*i+2]; bi = vb[2*i+3];
    VCPLXMUL(ar, ai, br, bi);
    vab[2*i+2] = VMADD(ar, vscal, vab[2*i+2]);
    vab[2*i+3] = VMADD(ai, vscal, vab[2*i+3]);
  }
#endif
  if (s->transform == PFFFT_REAL) {
    ((v4sf_union*)vab)[0].f[0] = abr + ar*br*scaling;
    ((v4sf_union*)vab)[1].f[0] = abi + ai*bi*scaling;
  }
}